

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

void glist_noselect(_glist *x)

{
  _glist *x_local;
  
  if (x->gl_editor != (t_editor *)0x0) {
    while (x->gl_editor->e_selection != (t_selection *)0x0) {
      glist_deselect(x,x->gl_editor->e_selection->sel_what);
    }
    if (((byte)x->gl_editor->field_0x88 >> 5 & 1) != 0) {
      glist_deselectline(x);
    }
  }
  return;
}

Assistant:

void glist_noselect(t_glist *x)
{
    if (x->gl_editor)
    {
        while (x->gl_editor->e_selection)
            glist_deselect(x, x->gl_editor->e_selection->sel_what);
        if (x->gl_editor->e_selectedline)
            glist_deselectline(x);
    }
}